

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauCanon.c
# Opt level: O3

int Abc_Tt6CofactorPermNaive(word *pTruth,int i,int fSwapOnly)

{
  ulong uVar1;
  uint uVar2;
  byte bVar3;
  byte bVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  
  uVar1 = *pTruth;
  bVar3 = (byte)i;
  if (fSwapOnly == 0) {
    bVar4 = (byte)(1 << (bVar3 & 0x1f));
    uVar6 = s_Truths6[i];
    uVar8 = (uVar6 & uVar1) >> (bVar4 & 0x3f) | uVar1 << (bVar4 & 0x3f) & uVar6;
    bVar3 = (byte)(1 << (bVar3 + 1 & 0x1f));
    uVar10 = s_Truths6[(long)i + 1];
    uVar7 = (uVar8 & uVar10) >> (bVar3 & 0x3f) | uVar8 << (bVar3 & 0x3f) & uVar10;
    uVar12 = (uVar7 & uVar6) >> (bVar4 & 0x3f) | uVar7 << (bVar4 & 0x3f) & uVar6;
    uVar13 = (uVar12 & s_PMasks[i][2]) >> (bVar4 & 0x3f) |
             (uVar12 & s_PMasks[i][1]) << (bVar4 & 0x3f) | uVar12 & s_PMasks[i][0];
    uVar14 = (uVar13 & uVar10) >> (bVar3 & 0x3f) | uVar13 << (bVar3 & 0x3f) & uVar10;
    uVar11 = (uVar6 & uVar14) >> (bVar4 & 0x3f) | uVar14 << (bVar4 & 0x3f) & uVar6;
    uVar6 = (uVar10 & uVar11) >> (bVar3 & 0x3f) | uVar11 << (bVar3 & 0x3f) & uVar10;
    if (((s_PMasks[i][2] & uVar6) >> (bVar4 & 0x3f) |
        (s_PMasks[i][1] & uVar6) << (bVar4 & 0x3f) | s_PMasks[i][0] & uVar6) != uVar1) {
      __assert_fail("Copy == pTruth[0]",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/dau/dauCanon.c"
                    ,0x315,"int Abc_Tt6CofactorPermNaive(word *, int, int)");
    }
    uVar10 = uVar8;
    if (uVar1 < uVar8) {
      uVar10 = uVar1;
    }
    uVar9 = uVar10;
    if (uVar7 <= uVar10) {
      uVar9 = uVar7;
    }
    uVar5 = 3;
    if (uVar10 <= uVar7) {
      uVar5 = (uint)(uVar8 < uVar1);
    }
    uVar10 = uVar9;
    if (uVar12 <= uVar9) {
      uVar10 = uVar12;
    }
    uVar2 = 2;
    if (uVar9 <= uVar12) {
      uVar2 = uVar5;
    }
    uVar7 = uVar10;
    if (uVar13 <= uVar10) {
      uVar7 = uVar13;
    }
    uVar5 = 6;
    if (uVar10 <= uVar13) {
      uVar5 = uVar2;
    }
    uVar10 = uVar7;
    if (uVar14 <= uVar7) {
      uVar10 = uVar14;
    }
    uVar2 = 7;
    if (uVar7 <= uVar14) {
      uVar2 = uVar5;
    }
    uVar7 = uVar10;
    if (uVar11 <= uVar10) {
      uVar7 = uVar11;
    }
    uVar5 = 5;
    if (uVar10 <= uVar11) {
      uVar5 = uVar2;
    }
    uVar2 = 4;
    if (uVar7 <= uVar6) {
      uVar2 = uVar5;
    }
    if (uVar6 <= uVar7) {
      uVar7 = uVar6;
    }
    if (uVar1 < uVar7) {
      __assert_fail("Best <= pTruth[0]",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/dau/dauCanon.c"
                    ,0x316,"int Abc_Tt6CofactorPermNaive(word *, int, int)");
    }
  }
  else {
    bVar3 = (byte)(1 << (bVar3 & 0x1f));
    uVar7 = (s_PMasks[i][2] & uVar1) >> (bVar3 & 0x3f) |
            (s_PMasks[i][1] & uVar1) << (bVar3 & 0x3f) | s_PMasks[i][0] & uVar1;
    uVar2 = 4;
    if (uVar1 <= uVar7) {
      return 0;
    }
  }
  *pTruth = uVar7;
  return uVar2;
}

Assistant:

int Abc_Tt6CofactorPermNaive( word * pTruth, int i, int fSwapOnly )
{
    if ( fSwapOnly )
    {
        word Copy = Abc_Tt6SwapAdjacent( pTruth[0], i );
        if ( pTruth[0] > Copy )
        {
            pTruth[0] = Copy;
            return 4;
        }
        return 0;
    }
    {
        word Copy = pTruth[0];
        word Best = pTruth[0];
        int Config = 0;
        // PXY
        // 001
        Copy = Abc_Tt6Flip( Copy, i );
        if ( Best > Copy )
            Best = Copy, Config = 1;
        // PXY
        // 011
        Copy = Abc_Tt6Flip( Copy, i+1 );
        if ( Best > Copy )
            Best = Copy, Config = 3;
        // PXY
        // 010
        Copy = Abc_Tt6Flip( Copy, i );
        if ( Best > Copy )
            Best = Copy, Config = 2;
        // PXY
        // 110
        Copy = Abc_Tt6SwapAdjacent( Copy, i );
        if ( Best > Copy )
            Best = Copy, Config = 6;
        // PXY
        // 111
        Copy = Abc_Tt6Flip( Copy, i+1 );
        if ( Best > Copy )
            Best = Copy, Config = 7;
        // PXY
        // 101
        Copy = Abc_Tt6Flip( Copy, i );
        if ( Best > Copy )
            Best = Copy, Config = 5;
        // PXY
        // 100
        Copy = Abc_Tt6Flip( Copy, i+1 );
        if ( Best > Copy )
            Best = Copy, Config = 4;
        // PXY
        // 000
        Copy = Abc_Tt6SwapAdjacent( Copy, i );
        assert( Copy == pTruth[0] );
        assert( Best <= pTruth[0] );
        pTruth[0] = Best;
        return Config;
    }
}